

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

absl * __thiscall absl::StrCat_abi_cxx11_(absl *this,AlphaNum *a,AlphaNum *b)

{
  reference pcVar1;
  size_type sVar2;
  size_type sVar3;
  char *pcVar4;
  long lVar5;
  char *out;
  reference local_40;
  char *begin;
  undefined1 local_21;
  AlphaNum *local_20;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result;
  
  local_21 = 0;
  local_20 = b;
  b_local = a;
  a_local = (AlphaNum *)this;
  std::__cxx11::string::string((string *)this);
  sVar2 = AlphaNum::size(b_local);
  sVar3 = AlphaNum::size(local_20);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,sVar2 + sVar3
            );
  out = (char *)std::__cxx11::string::begin();
  local_40 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  pcVar4 = Append(local_40,b_local);
  pcVar4 = Append(pcVar4,local_20);
  pcVar1 = local_40;
  lVar5 = std::__cxx11::string::size();
  if (pcVar4 != pcVar1 + lVar5) {
    __assert_fail("out == begin + result.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0x68,"string absl::StrCat(const AlphaNum &, const AlphaNum &)");
  }
  return this;
}

Assistant:

string StrCat(const AlphaNum& a, const AlphaNum& b) {
  string result;
  absl::strings_internal::STLStringResizeUninitialized(&result,
                                                       a.size() + b.size());
  char* const begin = &*result.begin();
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  assert(out == begin + result.size());
  return result;
}